

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

ON_SubDEdge * __thiscall ON_SubDFace::PrevEdge(ON_SubDFace *this,ON_SubDEdge *edge)

{
  ON_SubDEdgePtr *pOVar1;
  uint uVar2;
  ON_SubDEdge *pOVar3;
  
  uVar2 = EdgeArrayIndex(this,edge);
  if (uVar2 == 0xffffffff) {
    pOVar3 = (ON_SubDEdge *)0x0;
  }
  else {
    uVar2 = ((uVar2 + this->m_edge_count) - 1) % (uint)this->m_edge_count;
    pOVar1 = this->m_edge4;
    if (3 < uVar2) {
      pOVar1 = this->m_edgex + -4;
    }
    pOVar3 = (ON_SubDEdge *)
             (*(ulong *)((long)&pOVar1->m_ptr + (ulong)(uVar2 * 8)) & 0xfffffffffffffff8);
  }
  return pOVar3;
}

Assistant:

const ON_SubDEdge* ON_SubDFace::PrevEdge(
  const ON_SubDEdge* edge
  ) const
{
  unsigned int edge_index = EdgeArrayIndex(edge);
  if (ON_UNSET_UINT_INDEX == edge_index)
    return nullptr;
  const unsigned int edge_count = m_edge_count;
  edge_index = (edge_index + (edge_count - 1)) % edge_count;
  return Edge(edge_index);
}